

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O3

bool __thiscall ON_Xform::operator!=(ON_Xform *this,ON_Xform *rhs)

{
  double *pdVar1;
  double dVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  double *y;
  double *x;
  
  uVar4 = 0;
  do {
    if (0x7f < uVar4) {
      return false;
    }
    uVar5 = uVar4 + 8;
    dVar2 = *(double *)((long)this->m_xform[0] + uVar4);
    pdVar1 = (double *)((long)rhs->m_xform[0] + uVar4);
  } while ((dVar2 == *pdVar1) && (uVar4 = uVar5, !NAN(dVar2) && !NAN(*pdVar1)));
  while( true ) {
    bVar3 = 0x7f < uVar5;
    if (0x7f < uVar5) {
      return bVar3;
    }
    if (NAN(*(double *)((long)this->m_xform[0] + uVar5))) break;
    pdVar1 = (double *)((long)rhs->m_xform[0] + uVar5);
    uVar5 = uVar5 + 8;
    if (NAN(*pdVar1)) {
      return bVar3;
    }
  }
  return bVar3;
}

Assistant:

bool ON_Xform::operator!=(const ON_Xform& rhs) const
{
  // Intentionally returns false if any coefficient is a nan.
  const double* x = &m_xform[0][0];
  const double* x16 = x + 16;
  const double* y = &rhs.m_xform[0][0];
  while (x < x16)
  {
    double a = *x++;
    double b = *y++;
    if (a == b)
      continue;
    if (a != b)
    {
      while (x < x16)
      {
        a = *x++;
        b = *y++;
        if (a == a && b == b)
          continue;
        return false; // a or b is a nan.
      }
      return true;  // no nans and at least one not equal equalcoefficient.
    }
  }
  return false; // nans or equal
}